

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Storage.cpp
# Opt level: O1

void __thiscall CPU::Z80::ProcessorStorage::install_default_instruction_set(ProcessorStorage *this)

{
  RegisterPair16 *address;
  uchar *puVar1;
  uint8_t *value;
  RegisterPair16 *address_00;
  RegisterPair16 *address_01;
  RegisterPair16 *address_02;
  undefined4 local_10b8 [2];
  undefined8 local_10b0;
  undefined8 uStack_10a8;
  PartialMachineCycle local_10a0;
  undefined4 local_1078;
  undefined8 local_1070;
  undefined8 uStack_1068;
  PartialMachineCycle local_1060;
  undefined4 local_1038;
  undefined8 local_1030;
  undefined8 uStack_1028;
  PartialMachineCycle local_1020;
  undefined4 local_ff8 [2];
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  PartialMachineCycle local_fe0;
  undefined4 local_fb8;
  undefined8 local_fb0;
  undefined8 uStack_fa8;
  PartialMachineCycle local_fa0;
  undefined4 local_f78;
  undefined8 local_f70;
  undefined8 uStack_f68;
  PartialMachineCycle PStack_f60;
  undefined4 local_f38;
  undefined8 local_f30;
  undefined8 uStack_f28;
  PartialMachineCycle PStack_f20;
  undefined4 local_ef8;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  PartialMachineCycle PStack_ee0;
  undefined4 local_eb8 [2];
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  PartialMachineCycle local_ea0;
  undefined4 local_e78;
  undefined8 local_e70;
  undefined8 uStack_e68;
  PartialMachineCycle local_e60;
  undefined4 local_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  PartialMachineCycle local_e20;
  undefined4 local_df8;
  RegisterPair16 *local_df0;
  undefined8 local_de8;
  PartialMachineCycle local_de0;
  undefined4 local_db8;
  undefined8 local_db0;
  undefined8 uStack_da8;
  PartialMachineCycle local_da0;
  undefined4 local_d78 [2];
  undefined8 local_d70;
  undefined8 uStack_d68;
  PartialMachineCycle local_d60;
  undefined4 local_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  PartialMachineCycle local_d20;
  undefined4 local_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  PartialMachineCycle PStack_ce0;
  undefined4 local_cb8;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  PartialMachineCycle local_ca0;
  undefined4 local_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  PartialMachineCycle PStack_c60;
  undefined4 local_c38;
  RegisterPair16 *local_c30;
  undefined8 local_c28;
  PartialMachineCycle PStack_c20;
  undefined4 local_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  PartialMachineCycle PStack_be0;
  undefined4 local_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  PartialMachineCycle PStack_ba0;
  undefined4 local_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  PartialMachineCycle PStack_b60;
  undefined4 local_b38;
  RegisterPair16 *local_b30;
  undefined8 local_b28;
  PartialMachineCycle PStack_b20;
  undefined4 local_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  PartialMachineCycle PStack_ae0;
  undefined4 local_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  PartialMachineCycle PStack_aa0;
  undefined4 local_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  PartialMachineCycle PStack_a60;
  undefined4 local_a38;
  undefined1 *local_a30;
  undefined1 *local_a28;
  PartialMachineCycle PStack_a20;
  undefined4 local_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  PartialMachineCycle PStack_9e0;
  undefined4 local_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  PartialMachineCycle PStack_9a0;
  undefined4 local_978;
  undefined8 local_970;
  undefined8 uStack_968;
  PartialMachineCycle local_960;
  undefined4 local_938;
  RegisterPair16 *local_930;
  undefined8 local_928;
  PartialMachineCycle local_920;
  undefined4 local_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  PartialMachineCycle local_8e0;
  undefined4 local_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  PartialMachineCycle local_8a0;
  undefined4 local_878;
  undefined8 local_870;
  undefined8 uStack_868;
  PartialMachineCycle local_860;
  undefined4 local_838;
  undefined8 local_830;
  undefined8 uStack_828;
  PartialMachineCycle local_820;
  undefined4 local_7f8 [2];
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  PartialMachineCycle local_7e0;
  undefined4 local_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  PartialMachineCycle local_7a0;
  undefined4 local_778;
  undefined8 local_770;
  undefined8 uStack_768;
  PartialMachineCycle PStack_760;
  undefined4 local_738;
  undefined8 local_730;
  undefined8 uStack_728;
  PartialMachineCycle PStack_720;
  undefined4 local_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  PartialMachineCycle PStack_6e0;
  undefined4 local_6b8;
  RegisterPair16 *local_6b0;
  undefined8 local_6a8;
  PartialMachineCycle PStack_6a0;
  undefined4 local_678;
  undefined8 local_670;
  undefined8 uStack_668;
  PartialMachineCycle PStack_660;
  undefined4 local_638;
  undefined8 local_630;
  undefined8 uStack_628;
  PartialMachineCycle PStack_620;
  undefined4 local_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  PartialMachineCycle PStack_5e0;
  undefined4 local_5b8;
  RegisterPair16 *local_5b0;
  undefined8 local_5a8;
  PartialMachineCycle PStack_5a0;
  undefined4 local_578;
  undefined8 local_570;
  undefined8 uStack_568;
  PartialMachineCycle PStack_560;
  undefined4 local_538;
  undefined8 local_530;
  undefined8 uStack_528;
  PartialMachineCycle PStack_520;
  undefined4 local_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  PartialMachineCycle PStack_4e0;
  undefined4 local_4b8;
  RegisterPair16 *local_4b0;
  RegisterPair16 *local_4a8;
  PartialMachineCycle PStack_4a0;
  undefined4 local_478;
  undefined8 local_470;
  undefined8 uStack_468;
  PartialMachineCycle PStack_460;
  undefined4 local_438 [2];
  undefined8 local_430;
  undefined8 uStack_428;
  PartialMachineCycle local_420;
  undefined4 local_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  PartialMachineCycle local_3e0;
  undefined4 local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  PartialMachineCycle local_3a0;
  undefined4 local_378;
  undefined8 local_370;
  undefined8 uStack_368;
  PartialMachineCycle local_360;
  undefined4 local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  PartialMachineCycle local_320;
  undefined4 local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  PartialMachineCycle local_2e0;
  undefined4 local_2b8;
  RegisterPair16 *local_2b0;
  undefined8 local_2a8;
  PartialMachineCycle PStack_2a0;
  undefined4 local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  PartialMachineCycle PStack_260;
  undefined4 local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  PartialMachineCycle PStack_220;
  undefined4 local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  PartialMachineCycle PStack_1e0;
  undefined4 local_1b8;
  RegisterPair16 *local_1b0;
  undefined8 local_1a8;
  PartialMachineCycle PStack_1a0;
  undefined4 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  PartialMachineCycle PStack_160;
  undefined4 local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  PartialMachineCycle PStack_120;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  PartialMachineCycle PStack_e0;
  undefined4 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  PartialMachineCycle PStack_a0;
  undefined4 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  PartialMachineCycle PStack_60;
  
  local_eb8[0] = 0;
  address = &this->pc_;
  puVar1 = &(this->memptr_).halves.high;
  local_eb0 = 0;
  uStack_ea8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_ea0,ReadStart,(HalfCycles)0x3,&address->full,puVar1,false);
  local_e78 = 0;
  local_e70 = 0;
  uStack_e68 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_e60,ReadWait,(HalfCycles)0x2,&address->full,puVar1,true);
  local_e38 = 0;
  local_e30 = 0;
  uStack_e28 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_e20,Read,(HalfCycles)0x3,&address->full,puVar1,false);
  local_df8 = 0xb;
  local_de8 = 0;
  local_df0 = address;
  PartialMachineCycle::PartialMachineCycle(&local_de0);
  local_db8 = 3;
  local_db0 = 0;
  uStack_da8 = 0;
  PartialMachineCycle::PartialMachineCycle(&local_da0);
  (*this->_vptr_ProcessorStorage[1])(this,local_eb8,&this->conditional_call_untaken_program_);
  assemble_base_page(this,&this->base_page_,&this->hl_,false,&this->cb_page_);
  assemble_base_page(this,&this->dd_page_,&this->ix_,true,&this->ddcb_page_);
  assemble_base_page(this,&this->fd_page_,&this->iy_,true,&this->fdcb_page_);
  assemble_ed_page(this,&this->ed_page_);
  (this->fd_page_).is_indexed = true;
  (this->fdcb_page_).is_indexed = true;
  (this->dd_page_).is_indexed = true;
  (this->ddcb_page_).is_indexed = true;
  assemble_fetch_decode_execute(this,&this->base_page_,4);
  assemble_fetch_decode_execute(this,&this->dd_page_,4);
  assemble_fetch_decode_execute(this,&this->fd_page_,4);
  assemble_fetch_decode_execute(this,&this->ed_page_,4);
  assemble_fetch_decode_execute(this,&this->cb_page_,4);
  assemble_fetch_decode_execute(this,&this->fdcb_page_,3);
  assemble_fetch_decode_execute(this,&this->ddcb_page_,3);
  local_10b8[0] = 0;
  local_10b0 = 0;
  uStack_10a8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_10a0,Internal,(HalfCycles)0x6,&this->last_address_bus_,(uint8_t *)0x0,false);
  local_1078 = 0x5c;
  local_1070 = 0;
  uStack_1068 = 0;
  PartialMachineCycle::PartialMachineCycle(&local_1060);
  local_1038 = 3;
  local_1030 = 0;
  uStack_1028 = 0;
  PartialMachineCycle::PartialMachineCycle(&local_1020);
  local_438[0] = 0x47;
  local_430 = 0;
  uStack_428 = 0;
  PartialMachineCycle::PartialMachineCycle(&local_420);
  local_3f8 = 0;
  value = &this->operation_;
  local_3f0 = 0;
  uStack_3e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_3e0,ReadOpcodeStart,(HalfCycles)0x3,&address->full,value,false);
  local_3b8 = 0;
  local_3b0 = 0;
  uStack_3a8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_3a0,ReadOpcodeWait,(HalfCycles)0x2,&address->full,value,true);
  local_378 = 0;
  local_370 = 0;
  uStack_368 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_360,ReadOpcode,(HalfCycles)0x1,&address->full,value,false);
  local_338 = 0;
  address_00 = &this->refresh_addr_;
  local_330 = 0;
  uStack_328 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_320,Refresh,(HalfCycles)0x4,&address_00->full,(uint8_t *)0x0,false);
  local_2f8 = 0;
  local_2f0 = 0;
  uStack_2e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_2e0,Internal,(HalfCycles)0x2,&this->last_address_bus_,(uint8_t *)0x0,false);
  local_2b8 = 8;
  address_01 = &this->sp_;
  local_2a8 = 0;
  local_2b0 = address_01;
  PartialMachineCycle::PartialMachineCycle(&PStack_2a0);
  local_278 = 0;
  puVar1 = &(this->pc_).halves.high;
  local_270 = 0;
  uStack_268 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_260,WriteStart,(HalfCycles)0x3,&address_01->full,puVar1,false);
  local_238 = 0;
  local_230 = 0;
  uStack_228 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_220,WriteWait,(HalfCycles)0x2,&address_01->full,puVar1,true);
  local_1f8 = 0;
  local_1f0 = 0;
  uStack_1e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_1e0,Write,(HalfCycles)0x3,&address_01->full,puVar1,false);
  local_1b8 = 8;
  local_1a8 = 0;
  local_1b0 = address_01;
  PartialMachineCycle::PartialMachineCycle(&PStack_1a0);
  local_178 = 0;
  local_170 = 0;
  uStack_168 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_160,WriteStart,(HalfCycles)0x3,&address_01->full,(uint8_t *)&address->full,
             false);
  local_138 = 0;
  local_130 = 0;
  uStack_128 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_120,WriteWait,(HalfCycles)0x2,&address_01->full,(uint8_t *)&address->full,true)
  ;
  local_f8 = 0;
  local_f0 = 0;
  uStack_e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_e0,Write,(HalfCycles)0x3,&address_01->full,(uint8_t *)&address->full,false);
  local_b8 = 0x4b;
  local_b0 = 0;
  uStack_a8 = 0;
  PartialMachineCycle::PartialMachineCycle(&PStack_a0);
  local_78 = 3;
  local_70 = 0;
  uStack_68 = 0;
  PartialMachineCycle::PartialMachineCycle(&PStack_60);
  local_ff8[0] = 0x49;
  local_ff0 = 0;
  uStack_fe8 = 0;
  PartialMachineCycle::PartialMachineCycle(&local_fe0);
  local_fb8 = 0;
  local_fb0 = 0;
  uStack_fa8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_fa0,InterruptStart,(HalfCycles)0x5,&address->full,value,false);
  local_f78 = 0;
  local_f70 = 0;
  uStack_f68 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_f60,InterruptWait,(HalfCycles)0x2,&address->full,value,true);
  local_f38 = 0;
  local_f30 = 0;
  uStack_f28 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_f20,Interrupt,(HalfCycles)0x3,&address->full,value,false);
  local_ef8 = 2;
  local_ef0 = 0;
  uStack_ee8 = 0;
  PartialMachineCycle::PartialMachineCycle(&PStack_ee0);
  local_7f8[0] = 0x48;
  local_7f0 = 0;
  uStack_7e8 = 0;
  PartialMachineCycle::PartialMachineCycle(&local_7e0);
  local_7b8 = 0;
  local_7b0 = 0;
  uStack_7a8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_7a0,InterruptStart,(HalfCycles)0x7,&address->full,value,false);
  local_778 = 0;
  local_770 = 0;
  uStack_768 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_760,InterruptWait,(HalfCycles)0x2,&address->full,value,true);
  local_738 = 0;
  local_730 = 0;
  uStack_728 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_720,Interrupt,(HalfCycles)0x3,&address->full,value,false);
  local_6f8 = 0;
  local_6f0 = 0;
  uStack_6e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_6e0,Refresh,(HalfCycles)0x4,&address_00->full,(uint8_t *)0x0,false);
  local_6b8 = 8;
  local_6a8 = 0;
  local_6b0 = address_01;
  PartialMachineCycle::PartialMachineCycle(&PStack_6a0);
  local_678 = 0;
  local_670 = 0;
  uStack_668 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_660,WriteStart,(HalfCycles)0x3,&address_01->full,puVar1,false);
  local_638 = 0;
  local_630 = 0;
  uStack_628 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_620,WriteWait,(HalfCycles)0x2,&address_01->full,puVar1,true);
  local_5f8 = 0;
  local_5f0 = 0;
  uStack_5e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_5e0,Write,(HalfCycles)0x3,&address_01->full,puVar1,false);
  local_5b8 = 8;
  local_5a8 = 0;
  local_5b0 = address_01;
  PartialMachineCycle::PartialMachineCycle(&PStack_5a0);
  local_578 = 0;
  local_570 = 0;
  uStack_568 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_560,WriteStart,(HalfCycles)0x3,&address_01->full,(uint8_t *)&address->full,
             false);
  local_538 = 0;
  local_530 = 0;
  uStack_528 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_520,WriteWait,(HalfCycles)0x2,&address_01->full,(uint8_t *)&address->full,true)
  ;
  local_4f8 = 0;
  local_4f0 = 0;
  uStack_4e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_4e0,Write,(HalfCycles)0x3,&address_01->full,(uint8_t *)&address->full,false);
  local_4b8 = 10;
  address_02 = &this->temp16_;
  local_4b0 = address_02;
  local_4a8 = address;
  PartialMachineCycle::PartialMachineCycle(&PStack_4a0);
  local_478 = 3;
  local_470 = 0;
  uStack_468 = 0;
  PartialMachineCycle::PartialMachineCycle(&PStack_460);
  local_d78[0] = 0x48;
  local_d70 = 0;
  uStack_d68 = 0;
  PartialMachineCycle::PartialMachineCycle(&local_d60);
  local_d38 = 0;
  local_d30 = 0;
  uStack_d28 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_d20,InterruptStart,(HalfCycles)0x7,&address->full,(uint8_t *)&address_02->full,
             false);
  local_cf8 = 0;
  local_cf0 = 0;
  uStack_ce8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_ce0,InterruptWait,(HalfCycles)0x2,&address->full,(uint8_t *)&address_02->full,
             true);
  local_cb8 = 0;
  local_cb0 = 0;
  uStack_ca8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_ca0,Interrupt,(HalfCycles)0x3,&address->full,(uint8_t *)&address_02->full,false)
  ;
  local_c78 = 0;
  local_c70 = 0;
  uStack_c68 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_c60,Refresh,(HalfCycles)0x4,&address_00->full,(uint8_t *)0x0,false);
  local_c38 = 8;
  local_c28 = 0;
  local_c30 = address_01;
  PartialMachineCycle::PartialMachineCycle(&PStack_c20);
  local_bf8 = 0;
  local_bf0 = 0;
  uStack_be8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_be0,WriteStart,(HalfCycles)0x3,&address_01->full,puVar1,false);
  local_bb8 = 0;
  local_bb0 = 0;
  uStack_ba8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_ba0,WriteWait,(HalfCycles)0x2,&address_01->full,puVar1,true);
  local_b78 = 0;
  local_b70 = 0;
  uStack_b68 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_b60,Write,(HalfCycles)0x3,&address_01->full,puVar1,false);
  local_b38 = 8;
  local_b28 = 0;
  local_b30 = address_01;
  PartialMachineCycle::PartialMachineCycle(&PStack_b20);
  local_af8 = 0;
  local_af0 = 0;
  uStack_ae8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_ae0,WriteStart,(HalfCycles)0x3,&address_01->full,(uint8_t *)&address->full,
             false);
  local_ab8 = 0;
  local_ab0 = 0;
  uStack_aa8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_aa0,WriteWait,(HalfCycles)0x2,&address_01->full,(uint8_t *)&address->full,true)
  ;
  local_a78 = 0;
  local_a70 = 0;
  uStack_a68 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_a60,Write,(HalfCycles)0x3,&address_01->full,(uint8_t *)&address->full,false);
  local_a38 = 9;
  local_a30 = (undefined1 *)((long)&this->ir_ + 1);
  local_a28 = (undefined1 *)((long)&this->temp16_ + 1);
  PartialMachineCycle::PartialMachineCycle(&PStack_a20);
  local_9f8 = 0;
  local_9f0 = 0;
  uStack_9e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_9e0,ReadStart,(HalfCycles)0x3,&address_02->full,(uint8_t *)&address->full,false
            );
  local_9b8 = 0;
  local_9b0 = 0;
  uStack_9a8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_9a0,ReadWait,(HalfCycles)0x2,&address_02->full,(uint8_t *)&address->full,true);
  local_978 = 0;
  local_970 = 0;
  uStack_968 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_960,Read,(HalfCycles)0x3,&address_02->full,(uint8_t *)&address->full,false);
  local_938 = 6;
  local_928 = 0;
  local_930 = address_02;
  PartialMachineCycle::PartialMachineCycle(&local_920);
  local_8f8 = 0;
  local_8f0 = 0;
  uStack_8e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_8e0,ReadStart,(HalfCycles)0x3,&address_02->full,puVar1,false);
  local_8b8 = 0;
  local_8b0 = 0;
  uStack_8a8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_8a0,ReadWait,(HalfCycles)0x2,&address_02->full,puVar1,true);
  local_878 = 0;
  local_870 = 0;
  uStack_868 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_860,Read,(HalfCycles)0x3,&address_02->full,puVar1,false);
  local_838 = 3;
  local_830 = 0;
  uStack_828 = 0;
  PartialMachineCycle::PartialMachineCycle(&local_820);
  (*this->_vptr_ProcessorStorage[1])(this,local_10b8,&this->reset_program_);
  (*this->_vptr_ProcessorStorage[1])(this,local_438,&this->nmi_program_);
  (*this->_vptr_ProcessorStorage[1])(this,local_ff8,this->irq_program_);
  (*this->_vptr_ProcessorStorage[1])(this,local_7f8,this->irq_program_ + 1);
  (*this->_vptr_ProcessorStorage[1])(this,local_d78,this->irq_program_ + 2);
  return;
}

Assistant:

void ProcessorStorage::install_default_instruction_set() {
	MicroOp conditional_call_untaken_program[] = Sequence(ReadInc(pc_, memptr_.halves.high));
	copy_program(conditional_call_untaken_program, conditional_call_untaken_program_);

	assemble_base_page(base_page_, hl_, false, cb_page_);
	assemble_base_page(dd_page_, ix_, true, ddcb_page_);
	assemble_base_page(fd_page_, iy_, true, fdcb_page_);
	assemble_ed_page(ed_page_);

	fd_page_.is_indexed = true;
	fdcb_page_.is_indexed = true;
	dd_page_.is_indexed = true;
	ddcb_page_.is_indexed = true;

	assemble_fetch_decode_execute(base_page_, 4);
	assemble_fetch_decode_execute(dd_page_, 4);
	assemble_fetch_decode_execute(fd_page_, 4);
	assemble_fetch_decode_execute(ed_page_, 4);
	assemble_fetch_decode_execute(cb_page_, 4);

	assemble_fetch_decode_execute(fdcb_page_, 3);
	assemble_fetch_decode_execute(ddcb_page_, 3);

	MicroOp reset_program[] = Sequence(InternalOperation(6), {MicroOp::Reset});

	// Justification for NMI timing: per Wilf Rigter on the ZX81 (http://www.user.dccnet.com/wrigter/index_files/ZX81WAIT.htm),
	// wait cycles occur between T2 and T3 during NMI; extending the refresh cycle is also consistent with my guess
	// for the action of other non-four-cycle opcode fetches
	MicroOp nmi_program[] = {
		{ MicroOp::BeginNMI },
		BusOp(ReadOpcodeStart()),
		BusOp(ReadOpcodeWait(true)),
		BusOp(ReadOpcodeEnd()),
		BusOp(Refresh()),
		InternalOperation(2),
		Push(pc_),
		{ MicroOp::JumpTo66 },
		{ MicroOp::MoveToNextProgram }
	};
	MicroOp irq_mode0_program[] = {
		{ MicroOp::BeginIRQMode0 },
		BusOp(IntAckStart(5, operation_)),
		BusOp(IntWait(operation_)),
		BusOp(IntAckEnd(operation_)),
		{ MicroOp::DecodeOperation }
	};
	MicroOp irq_mode1_program[] = {
		{ MicroOp::BeginIRQ },
		BusOp(IntAckStart(7, operation_)),	// 7 half cycles (including  +
		BusOp(IntWait(operation_)),			// [potentially 2 half cycles] +
		BusOp(IntAckEnd(operation_)),		// Implicitly 3 half cycles +
		BusOp(Refresh()),					// 4 half cycles +
		Push(pc_),							// 12 half cycles = 26 half cycles = 13 cycles
		{ MicroOp::Move16, &temp16_.full, &pc_.full },
		{ MicroOp::MoveToNextProgram }
	};
	MicroOp irq_mode2_program[] = {
		{ MicroOp::BeginIRQ },
		BusOp(IntAckStart(7, temp16_.halves.low)),
		BusOp(IntWait(temp16_.halves.low)),
		BusOp(IntAckEnd(temp16_.halves.low)),
		BusOp(Refresh()),
		Push(pc_),
		{ MicroOp::Move8, &ir_.halves.high, &temp16_.halves.high },
		Read16(temp16_, pc_),
		{ MicroOp::MoveToNextProgram }
	};

	copy_program(reset_program, reset_program_);
	copy_program(nmi_program, nmi_program_);
	copy_program(irq_mode0_program, irq_program_[0]);
	copy_program(irq_mode1_program, irq_program_[1]);
	copy_program(irq_mode2_program, irq_program_[2]);
}